

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall spdlog::details::registry::drop(registry *this,string *logger_name)

{
  element_type *peVar1;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&(this->loggers_)._M_h,logger_name);
  peVar1 = (this->default_logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 != (element_type *)0x0) &&
     (__n = (peVar1->name_)._M_string_length, __n == logger_name->_M_string_length)) {
    if (__n != 0) {
      iVar2 = bcmp((peVar1->name_)._M_dataplus._M_p,(logger_name->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_0010b347;
    }
    this_00 = (this->default_logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->default_logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->default_logger_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
LAB_0010b347:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::drop(const std::string &logger_name)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    loggers_.erase(logger_name);
    if (default_logger_ && default_logger_->name() == logger_name)
    {
        default_logger_.reset();
    }
}